

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_visitor.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalOperatorVisitor::VisitExpression
          (LogicalOperatorVisitor *this,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  type this_00;
  BoundAggregateExpression *pBVar2;
  BoundBetweenExpression *pBVar3;
  BoundReferenceExpression *pBVar4;
  BoundComparisonExpression *pBVar5;
  BoundSubqueryExpression *pBVar6;
  BoundOperatorExpression *pBVar7;
  BoundCastExpression *pBVar8;
  BoundUnnestExpression *pBVar9;
  BoundColumnRefExpression *pBVar10;
  BoundDefaultExpression *pBVar11;
  BoundCaseExpression *pBVar12;
  BoundConjunctionExpression *pBVar13;
  BoundWindowExpression *pBVar14;
  BoundConstantExpression *pBVar15;
  BoundParameterExpression *pBVar16;
  BoundFunctionExpression *pBVar17;
  InternalException *this_01;
  string local_48;
  
  this_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (expression);
  switch((this_00->super_BaseExpression).expression_class) {
  case BOUND_AGGREGATE:
    pBVar2 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[5])(&local_48,this,pBVar2,expression);
    break;
  case BOUND_CASE:
    pBVar12 = BaseExpression::Cast<duckdb::BoundCaseExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[7])(&local_48,this,pBVar12,expression);
    break;
  case BOUND_CAST:
    pBVar8 = BaseExpression::Cast<duckdb::BoundCastExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[8])(&local_48,this,pBVar8,expression);
    break;
  case BOUND_COLUMN_REF:
    pBVar10 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&this_00->super_BaseExpression)
    ;
    (*this->_vptr_LogicalOperatorVisitor[9])(&local_48,this,pBVar10,expression);
    break;
  case BOUND_COMPARISON:
    pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>(&this_00->super_BaseExpression)
    ;
    (*this->_vptr_LogicalOperatorVisitor[10])(&local_48,this,pBVar5,expression);
    break;
  case BOUND_CONJUNCTION:
    pBVar13 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                        (&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0xb])(&local_48,this,pBVar13,expression);
    break;
  case BOUND_CONSTANT:
    pBVar15 = BaseExpression::Cast<duckdb::BoundConstantExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0xc])(&local_48,this,pBVar15,expression);
    break;
  case BOUND_DEFAULT:
    pBVar11 = BaseExpression::Cast<duckdb::BoundDefaultExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0xd])(&local_48,this,pBVar11,expression);
    break;
  case BOUND_FUNCTION:
    pBVar17 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0xe])(&local_48,this,pBVar17,expression);
    break;
  case BOUND_OPERATOR:
    pBVar7 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0xf])(&local_48,this,pBVar7,expression);
    break;
  case BOUND_PARAMETER:
    pBVar16 = BaseExpression::Cast<duckdb::BoundParameterExpression>(&this_00->super_BaseExpression)
    ;
    (*this->_vptr_LogicalOperatorVisitor[0x12])(&local_48,this,pBVar16,expression);
    break;
  case BOUND_REF:
    pBVar4 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0x10])(&local_48,this,pBVar4,expression);
    break;
  case BOUND_SUBQUERY:
    pBVar6 = BaseExpression::Cast<duckdb::BoundSubqueryExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0x11])(&local_48,this,pBVar6,expression);
    break;
  case BOUND_WINDOW:
    pBVar14 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0x13])(&local_48,this,pBVar14,expression);
    break;
  case BOUND_BETWEEN:
    pBVar3 = BaseExpression::Cast<duckdb::BoundBetweenExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[6])(&local_48,this,pBVar3,expression);
    break;
  case BOUND_UNNEST:
    pBVar9 = BaseExpression::Cast<duckdb::BoundUnnestExpression>(&this_00->super_BaseExpression);
    (*this->_vptr_LogicalOperatorVisitor[0x14])(&local_48,this,pBVar9,expression);
    break;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unrecognized expression type in logical operator visitor","");
    InternalException::InternalException(this_01,&local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((Expression *)local_48._M_dataplus._M_p == (Expression *)0x0) {
    (*this->_vptr_LogicalOperatorVisitor[4])(this,this_00);
  }
  else {
    _Var1._M_head_impl =
         (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
         )._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (expression->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (Expression *)local_48._M_dataplus._M_p;
    if (_Var1._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
  }
  return;
}

Assistant:

void LogicalOperatorVisitor::VisitExpression(unique_ptr<Expression> *expression) {
	auto &expr = **expression;
	unique_ptr<Expression> result;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BOUND_AGGREGATE:
		result = VisitReplace(expr.Cast<BoundAggregateExpression>(), expression);
		break;
	case ExpressionClass::BOUND_BETWEEN:
		result = VisitReplace(expr.Cast<BoundBetweenExpression>(), expression);
		break;
	case ExpressionClass::BOUND_CASE:
		result = VisitReplace(expr.Cast<BoundCaseExpression>(), expression);
		break;
	case ExpressionClass::BOUND_CAST:
		result = VisitReplace(expr.Cast<BoundCastExpression>(), expression);
		break;
	case ExpressionClass::BOUND_COLUMN_REF:
		result = VisitReplace(expr.Cast<BoundColumnRefExpression>(), expression);
		break;
	case ExpressionClass::BOUND_COMPARISON:
		result = VisitReplace(expr.Cast<BoundComparisonExpression>(), expression);
		break;
	case ExpressionClass::BOUND_CONJUNCTION:
		result = VisitReplace(expr.Cast<BoundConjunctionExpression>(), expression);
		break;
	case ExpressionClass::BOUND_CONSTANT:
		result = VisitReplace(expr.Cast<BoundConstantExpression>(), expression);
		break;
	case ExpressionClass::BOUND_FUNCTION:
		result = VisitReplace(expr.Cast<BoundFunctionExpression>(), expression);
		break;
	case ExpressionClass::BOUND_SUBQUERY:
		result = VisitReplace(expr.Cast<BoundSubqueryExpression>(), expression);
		break;
	case ExpressionClass::BOUND_OPERATOR:
		result = VisitReplace(expr.Cast<BoundOperatorExpression>(), expression);
		break;
	case ExpressionClass::BOUND_PARAMETER:
		result = VisitReplace(expr.Cast<BoundParameterExpression>(), expression);
		break;
	case ExpressionClass::BOUND_REF:
		result = VisitReplace(expr.Cast<BoundReferenceExpression>(), expression);
		break;
	case ExpressionClass::BOUND_DEFAULT:
		result = VisitReplace(expr.Cast<BoundDefaultExpression>(), expression);
		break;
	case ExpressionClass::BOUND_WINDOW:
		result = VisitReplace(expr.Cast<BoundWindowExpression>(), expression);
		break;
	case ExpressionClass::BOUND_UNNEST:
		result = VisitReplace(expr.Cast<BoundUnnestExpression>(), expression);
		break;
	default:
		throw InternalException("Unrecognized expression type in logical operator visitor");
	}
	if (result) {
		*expression = std::move(result);
	} else {
		// visit the children of this node
		VisitExpressionChildren(expr);
	}
}